

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnTableInitExpr
          (ExprVisitorDelegate *this,TableInitExpr *expr)

{
  WatWriter *this_00;
  Info local_68;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::TableInit_Opcode);
  WritePuts(this_00,local_68.name,Space);
  if ((expr->table_index).field_2.index_ != 0 || (expr->table_index).type_ != Index) {
    WriteVar(this->writer_,&expr->table_index,Space);
  }
  WriteVar(this->writer_,&expr->segment_index,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnTableInitExpr(TableInitExpr* expr) {
  writer_->WritePutsSpace(Opcode::TableInit_Opcode.GetName());
  writer_->WriteVarUnlessZero(expr->table_index, NextChar::Space);
  writer_->WriteVar(expr->segment_index, NextChar::Newline);
  return Result::Ok;
}